

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  uint *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  fpclass_type fVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  pointer pnVar13;
  long lVar14;
  type t;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  iVar7 = (rhs->super_IdxSet).len;
  *(int *)(this + 0xc) = iVar7;
  spx_realloc<int*>((int **)(this + 0x10),iVar7);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(this + 0x20),
          (int)((ulong)((long)(rhs->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(rhs->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,true);
  *(element_type **)(this + 0x40) =
       (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x48),
             &(rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (rhs->setupStatus == true) {
    IdxSet::operator=((IdxSet *)this,&rhs->super_IdxSet);
    if (0 < (long)*(int *)(this + 8)) {
      uVar9 = (long)*(int *)(this + 8) + 1;
      do {
        lVar10 = (long)(*(int **)(this + 0x10))[uVar9 - 2];
        pnVar13 = (rhs->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar10 * 0x38;
        lVar14 = *(long *)(this + 0x20);
        *(undefined8 *)(lVar14 + 0x20 + lVar11) =
             *(undefined8 *)((long)&pnVar13[lVar10].m_backend.data + 0x20);
        uVar4 = *(undefined8 *)&pnVar13[lVar10].m_backend.data;
        uVar5 = *(undefined8 *)((long)&pnVar13[lVar10].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar13[lVar10].m_backend.data + 0x10);
        uVar6 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (undefined8 *)(lVar14 + 0x10 + lVar11);
        *puVar2 = *(undefined8 *)puVar1;
        puVar2[1] = uVar6;
        *(undefined8 *)(lVar14 + lVar11) = uVar4;
        ((undefined8 *)(lVar14 + lVar11))[1] = uVar5;
        *(int *)(lVar14 + 0x28 + lVar11) = pnVar13[lVar10].m_backend.exp;
        *(bool *)(lVar14 + 0x2c + lVar11) = pnVar13[lVar10].m_backend.neg;
        *(undefined8 *)(lVar14 + 0x30 + lVar11) = *(undefined8 *)&pnVar13[lVar10].m_backend.fpclass;
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
    }
  }
  else {
    uVar12 = (int)((long)(rhs->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(rhs->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
    *(undefined4 *)(this + 8) = 0;
    if ((int)uVar12 < 1) {
      iVar7 = 0;
    }
    else {
      lVar14 = 0;
      uVar9 = 0;
      do {
        pnVar13 = (rhs->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        fVar8 = cpp_dec_float_NaN;
        if (*(int *)((long)&(pnVar13->m_backend).data + lVar14 + 0x30) == 2) {
LAB_002aac17:
          local_a8.exp = *(int *)((long)&(pnVar13->m_backend).data + lVar14 + 0x28);
          local_a8.neg = *(bool *)((long)&(pnVar13->m_backend).data + lVar14 + 0x2c);
          local_a8.prec_elem = *(int32_t *)((long)&(pnVar13->m_backend).data + lVar14 + 0x34);
          puVar1 = (uint *)((long)&(pnVar13->m_backend).data + lVar14);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar13->m_backend).data + lVar14 + 0x10);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_a8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&(pnVar13->m_backend).data + lVar14 + 0x20);
          if ((local_a8.neg == true) &&
             (fVar8 != cpp_dec_float_finite || local_a8.data._M_elems[0] != 0)) {
            local_a8.neg = false;
          }
          local_a8.fpclass = fVar8;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_68,
                       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this);
          if (((local_a8.fpclass == cpp_dec_float_NaN) || (local_68.fpclass == cpp_dec_float_NaN))
             || (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_a8,&local_68), iVar7 < 1)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       ((long)&(((rhs->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                       lVar14),0);
          }
          else {
            (rhs->super_IdxSet).idx[*(int *)(this + 8)] = (int)uVar9;
            *(int *)(*(long *)(this + 0x10) + (long)*(int *)(this + 8) * 4) = (int)uVar9;
            pnVar13 = (rhs->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar10 = *(long *)(this + 0x20);
            *(undefined8 *)(lVar10 + 0x20 + lVar14) =
                 *(undefined8 *)((long)&(pnVar13->m_backend).data + lVar14 + 0x20);
            puVar2 = (undefined8 *)((long)&(pnVar13->m_backend).data + lVar14);
            uVar4 = *puVar2;
            uVar5 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar13->m_backend).data + lVar14 + 0x10);
            uVar6 = puVar2[1];
            puVar3 = (undefined8 *)(lVar10 + 0x10 + lVar14);
            *puVar3 = *puVar2;
            puVar3[1] = uVar6;
            *(undefined8 *)(lVar10 + lVar14) = uVar4;
            ((undefined8 *)(lVar10 + lVar14))[1] = uVar5;
            *(undefined4 *)(lVar10 + 0x28 + lVar14) =
                 *(undefined4 *)((long)&(pnVar13->m_backend).data + lVar14 + 0x28);
            *(undefined1 *)(lVar10 + 0x2c + lVar14) =
                 *(undefined1 *)((long)&(pnVar13->m_backend).data + lVar14 + 0x2c);
            *(undefined8 *)(lVar10 + 0x30 + lVar14) =
                 *(undefined8 *)((long)&(pnVar13->m_backend).data + lVar14 + 0x30);
            *(int *)(this + 8) = *(int *)(this + 8) + 1;
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_a8,0,(type *)0x0);
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar13->m_backend).data + lVar14),&local_a8);
          if (iVar7 != 0) {
            pnVar13 = (rhs->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            fVar8 = *(fpclass_type *)((long)&(pnVar13->m_backend).data + lVar14 + 0x30);
            goto LAB_002aac17;
          }
        }
        uVar9 = uVar9 + 1;
        lVar14 = lVar14 + 0x38;
      } while ((uVar12 & 0x7fffffff) != uVar9);
      iVar7 = *(int *)(this + 8);
    }
    (rhs->super_IdxSet).num = iVar7;
    rhs->setupStatus = true;
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return;
}

Assistant:

void setup_and_assign(SSVectorBase<S>& rhs)
   {
      clear();
      setMax(rhs.max());
      VectorBase<R>::reDim(rhs.dim());
      _tolerances = rhs.tolerances();

      if(rhs.isSetup())
      {
         IdxSet::operator=(rhs);

         for(int i = size() - 1; i >= 0; --i)
         {
            int j  = index(i);
            VectorBase<R>::val[j] = rhs.val[j];
         }
      }
      else
      {
         int d = rhs.dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(rhs.val[i] != 0)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  rhs.idx[num] = i;
                  idx[num] = i;
                  VectorBase<R>::val[i] = rhs.val[i];
                  num++;
               }
               else
                  rhs.val[i] = 0;
            }
         }

         rhs.num = num;
         rhs.setupStatus = true;
      }

      setupStatus = true;

      assert(rhs.isConsistent());
      assert(isConsistent());
   }